

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O3

void __thiscall
dlib::logger::global_data::set_output_stream(global_data *this,string *name,streambuf *buf)

{
  auto_mutex M;
  auto_mutex local_38;
  streambuf *local_20;
  
  local_38.m = (mutex *)0x0;
  local_38.rw = (read_write_mutex *)0x0;
  local_38.r = &this->m;
  rmutex::lock(&this->m,1);
  local_20 = buf;
  assign_tables<dlib::logger::global_data::output_streambuf_container,std::streambuf*>
            (&this->streambuf_table,name,&local_20);
  auto_mutex::unlock(&local_38);
  return;
}

Assistant:

void logger::global_data::
    set_output_stream (
        const std::string& name,
        std::streambuf& buf 
    )
    {
        auto_mutex M(m);
        assign_tables( streambuf_table, name, &buf);
    }